

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O3

string * __thiscall
hbm::HttpPost::execute(string *__return_storage_ptr__,HttpPost *this,string *request)

{
  undefined1 *pBlock;
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  size_t sVar4;
  long lVar5;
  socklen_t in_ECX;
  string response;
  stringstream message;
  char recvBuffer [1024];
  SocketNonblocking socket;
  undefined1 *puStack_405f0;
  size_t sStack_405e8;
  undefined1 auStack_405e0 [16];
  stringstream asStack_405d0 [16];
  ostream aoStack_405c0 [112];
  ios_base aiStack_40550 [264];
  undefined1 *apuStack_40448 [2];
  undefined1 auStack_40438 [1007];
  undefined1 uStack_40049;
  SocketNonblocking SStack_40048;
  
  std::__cxx11::stringstream::stringstream(asStack_405d0);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"POST ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (aoStack_405c0,(this->m_httpPath)._M_dataplus._M_p,
                      (this->m_httpPath)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," HTTP/1.0\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"Host: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (aoStack_405c0,(this->m_address)._M_dataplus._M_p,
                      (this->m_address)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"Accept: */*\r\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (aoStack_405c0,"Content-Type: application/json; charset=utf-8",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"Content-Length: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_405c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(aoStack_405c0,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (aoStack_405c0,(request->_M_dataplus)._M_p,request->_M_string_length);
  SocketNonblocking::SocketNonblocking(&SStack_40048);
  SocketNonblocking::connect(&SStack_40048,(int)this,(sockaddr *)&this->m_port,in_ECX);
  std::__cxx11::stringbuf::str();
  pBlock = apuStack_40448[0];
  std::__cxx11::stringbuf::str();
  sVar3 = SocketNonblocking::sendBlock(&SStack_40048,pBlock,sStack_405e8,false);
  if (puStack_405f0 != auStack_405e0) {
    operator_delete(puStack_405f0);
  }
  if (apuStack_40448[0] != auStack_40438) {
    operator_delete(apuStack_40448[0]);
  }
  if (sVar3 < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    sVar3 = SocketNonblocking::receiveComplete(&SStack_40048,apuStack_40448,0x400);
    uStack_40049 = 0;
    sVar4 = strlen((char *)apuStack_40448);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)apuStack_40448,sVar4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    if (sVar3 < 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      if (execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_ == '\0') {
        iVar1 = __cxa_guard_acquire(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        if (iVar1 != 0) {
          execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_._M_dataplus._M_p =
               (pointer)&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,"\r\n\r\n",
                     "");
          __cxa_atexit(std::__cxx11::string::~string,
                       &execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_);
        }
      }
      puStack_405f0 = auStack_405e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&puStack_405f0,apuStack_40448,(long)apuStack_40448 + sVar3);
      lVar5 = std::__cxx11::string::find
                        ((char *)&puStack_405f0,
                         (ulong)execute(std::__cxx11::string_const&)::NEEDLE_abi_cxx11_._M_dataplus.
                                _M_p,0);
      if (lVar5 == -1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
      else {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&puStack_405f0);
      }
      if (puStack_405f0 != auStack_405e0) {
        operator_delete(puStack_405f0);
      }
    }
  }
  SocketNonblocking::~SocketNonblocking(&SStack_40048);
  std::__cxx11::stringstream::~stringstream(asStack_405d0);
  std::ios_base::~ios_base(aiStack_40550);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpPost::execute(const std::string& request)
	{
		std::stringstream message;
		message << "POST " << m_httpPath << " HTTP/1.0\r\n";
		message << "Host: " << m_address << "\r\n";
		message << "Accept: */*\r\n";
		message << "Content-Type: application/json; charset=utf-8" << "\r\n";
		message << "Content-Length: " << request.length() << "\r\n";
		message << "\r\n";
		message << request;

		SocketNonblocking socket;
		socket.connect(m_address, m_port);

		if(socket.sendBlock(message.str().c_str(), message.str().length(), 0)<=0) {
			return "";
		}

		char recvBuffer[1024];
		// important HTTP 1.0 will return the response and close the socket afterwards. This does look like a short read.
		ssize_t retVal = socket.receiveComplete(recvBuffer, sizeof(recvBuffer));
		// ensure termination!
		recvBuffer[sizeof(recvBuffer)-1] = '\0';

		std::cout << recvBuffer << std::endl;
		if(retVal>0) {
			static const std::string NEEDLE("\r\n\r\n");

			std::string response(recvBuffer, retVal);
			// body with response is to be found after the first empty line
			size_t position = response.find(NEEDLE);
			if(position == std::string::npos) {
				return "";
			} else {
				return response.substr(position+NEEDLE.length());
			}
		}
		return "";
	}